

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

OptionResult * option_parser_next(OptionResult *__return_storage_ptr__,OptionParser *parser)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  char **ppcVar4;
  char *pcVar5;
  int iVar6;
  size_t __n;
  Option *pOVar7;
  char *pcVar8;
  size_t sVar9;
  int iVar10;
  bool bVar11;
  
  iVar2 = parser->arg_index;
  iVar3 = parser->argc;
  if (iVar2 < iVar3) {
    ppcVar4 = parser->argv;
    iVar10 = iVar2 + 1;
    parser->arg_index = iVar10;
    pcVar8 = ppcVar4[iVar2];
    if (*pcVar8 == '-') {
      sVar9 = parser->num_options;
      if (pcVar8[1] == '-') {
        if (sVar9 != 0) {
          pOVar7 = parser->options;
          do {
            pcVar5 = pOVar7->long_name;
            if (pcVar5 != (char *)0x0) {
              __n = strlen(pcVar5);
              iVar6 = strncmp(pcVar8 + 2,pcVar5,__n);
              if (iVar6 == 0) {
                if (pOVar7->has_value == 0) {
                  __return_storage_ptr__->kind = OPTION_RESULT_KIND_OPTION;
                }
                else {
                  if (pcVar8[__n + 2] == '=') {
                    pcVar5 = pcVar8 + __n + 3;
                    pcVar1 = pcVar8 + __n + 3;
                    pcVar8 = (char *)0x0;
                    if (*pcVar5 != '\0') {
                      pcVar8 = pcVar1;
                    }
                    __return_storage_ptr__->kind =
                         (uint)(*pcVar5 != '\0') * 2 + OPTION_RESULT_KIND_EXPECTED_VALUE;
                    __return_storage_ptr__->option = pOVar7;
                    goto LAB_00108221;
                  }
                  if (iVar10 < iVar3) {
                    parser->arg_index = iVar2 + 2;
                    bVar11 = *ppcVar4[(long)iVar2 + 1] != '\0';
                    pcVar8 = (char *)0x0;
                    if (bVar11) {
                      pcVar8 = ppcVar4[(long)iVar2 + 1];
                    }
                    __return_storage_ptr__->kind =
                         (uint)bVar11 * 2 + OPTION_RESULT_KIND_EXPECTED_VALUE;
                    __return_storage_ptr__->option = pOVar7;
LAB_00108250:
                    (__return_storage_ptr__->field_2).value = pcVar8;
                    return __return_storage_ptr__;
                  }
                  __return_storage_ptr__->kind = OPTION_RESULT_KIND_EXPECTED_VALUE;
                }
                __return_storage_ptr__->option = pOVar7;
LAB_00108350:
                (__return_storage_ptr__->field_2).value = (char *)0x0;
                return __return_storage_ptr__;
              }
            }
            pOVar7 = pOVar7 + 1;
            sVar9 = sVar9 - 1;
          } while (sVar9 != 0);
        }
      }
      else if (sVar9 != 0) {
        pOVar7 = parser->options;
        do {
          if ((pOVar7->short_name != '\0') && (pOVar7->short_name == pcVar8[1])) {
            if (pcVar8[2] != '\0') {
              __return_storage_ptr__->kind = OPTION_RESULT_KIND_BAD_SHORT_OPTION;
              __return_storage_ptr__->option = pOVar7;
              goto LAB_00108250;
            }
            if (pOVar7->has_value == 0) {
              __return_storage_ptr__->kind = OPTION_RESULT_KIND_OPTION;
            }
            else {
              if (iVar10 < iVar3) {
                parser->arg_index = iVar2 + 2;
                bVar11 = *ppcVar4[iVar10] != '\0';
                pcVar8 = (char *)0x0;
                if (bVar11) {
                  pcVar8 = ppcVar4[iVar10];
                }
                __return_storage_ptr__->kind = (uint)bVar11 * 2 + OPTION_RESULT_KIND_EXPECTED_VALUE;
                __return_storage_ptr__->option = pOVar7;
                goto LAB_001081e9;
              }
              __return_storage_ptr__->kind = OPTION_RESULT_KIND_EXPECTED_VALUE;
            }
            __return_storage_ptr__->option = pOVar7;
            goto LAB_00108350;
          }
          pOVar7 = pOVar7 + 1;
          sVar9 = sVar9 - 1;
        } while (sVar9 != 0);
      }
      __return_storage_ptr__->kind = OPTION_RESULT_KIND_UNKNOWN;
      __return_storage_ptr__->option = (Option *)0x0;
LAB_00108221:
      (__return_storage_ptr__->field_2).value = pcVar8;
    }
    else {
      __return_storage_ptr__->kind = OPTION_RESULT_KIND_ARG;
      __return_storage_ptr__->option = (Option *)0x0;
LAB_001081e9:
      (__return_storage_ptr__->field_2).value = pcVar8;
    }
  }
  else {
    __return_storage_ptr__->kind = OPTION_RESULT_KIND_DONE;
    __return_storage_ptr__->option = (Option *)0x0;
    (__return_storage_ptr__->field_2).value = (char *)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

OptionResult option_parser_next(OptionParser* parser) {
  if (parser->arg_index >= parser->argc) {
    return make_option_result(OPTION_RESULT_KIND_DONE, NULL, NULL);
  }

  char* arg = parser->argv[parser->arg_index++];
  if (arg[0] == '-') {
    size_t i;
    if (arg[1] == '-') {
      /* Long option. */
      for (i = 0; i < parser->num_options; ++i) {
        const Option* option = &parser->options[i];
        if (!option->long_name) {
          continue;
        }

        size_t long_name_len = strlen(option->long_name);
        if (strncmp(&arg[2], option->long_name, long_name_len) == 0) {
          if (option->has_value) {
            if (arg[2 + long_name_len] == '=') {
              char* value = &arg[2 + long_name_len + 1];
              return make_option_result_with_value(OPTION_RESULT_KIND_OPTION,
                                                   option, value);
            } else {
              if (parser->arg_index >= parser->argc) {
                return make_option_result(OPTION_RESULT_KIND_EXPECTED_VALUE,
                                          option, NULL);
              }

              char* value = parser->argv[parser->arg_index++];
              return make_option_result_with_value(OPTION_RESULT_KIND_OPTION,
                                                   option, value);
            }
          } else {
            return make_option_result(OPTION_RESULT_KIND_OPTION, option, NULL);
          }
        }
      }
    } else {
      /* Short option. */
      for (i = 0; i < parser->num_options; ++i) {
        const Option* option = &parser->options[i];
        if (!option->short_name) {
          continue;
        }

        if (option->short_name == arg[1]) {
          if (arg[2] == 0) {
            if (option->has_value) {
              if (parser->arg_index >= parser->argc) {
                return make_option_result(OPTION_RESULT_KIND_EXPECTED_VALUE,
                                          option, NULL);
              }

              char* value = parser->argv[parser->arg_index++];
              return make_option_result_with_value(OPTION_RESULT_KIND_OPTION,
                                                   option, value);
            } else {
              return make_option_result(OPTION_RESULT_KIND_OPTION, option,
                                        NULL);
            }
          } else {
            return make_option_result(OPTION_RESULT_KIND_BAD_SHORT_OPTION,
                                      option, arg);
          }
        }
      }
    }

    return make_option_result(OPTION_RESULT_KIND_UNKNOWN, NULL, arg);
  } else {
    /* Argument. */
    return make_option_result(OPTION_RESULT_KIND_ARG, NULL, arg);
  }
}